

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x28);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x40091eb860000000;
  this_00[1].gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x405edd2f20000000;
  this_00[2]._vptr_Test = (_func_int **)0x42f6e9794048f5c3;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_001fbb40;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }